

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flattexture.cpp
# Opt level: O3

void __thiscall FFlatTexture::MakeTexture(FFlatTexture *this)

{
  ushort uVar1;
  BYTE *buffer;
  long lVar2;
  ushort uVar3;
  size_t __n;
  ulong len;
  FWadLump lump;
  FWadLump FStack_48;
  
  FWadCollection::OpenLumpNum(&FStack_48,&Wads,(this->super_FTexture).SourceLump);
  len = (ulong)(this->super_FTexture).Height * (ulong)(this->super_FTexture).Width;
  buffer = (BYTE *)operator_new__(len);
  this->Pixels = buffer;
  lVar2 = FWadLump::Read(&FStack_48,buffer,len);
  uVar3 = (this->super_FTexture).Width;
  uVar1 = (this->super_FTexture).Height;
  __n = (ulong)uVar1 * (ulong)uVar3 - lVar2;
  if (__n != 0 && lVar2 <= (long)((ulong)uVar1 * (ulong)uVar3)) {
    memset(this->Pixels + lVar2,0xbb,__n);
    uVar3 = (this->super_FTexture).Width;
    uVar1 = (this->super_FTexture).Height;
  }
  FTexture::FlipSquareBlockRemap(this->Pixels,(uint)uVar3,(uint)uVar1,GPalette.Remap);
  FWadLump::~FWadLump(&FStack_48);
  return;
}

Assistant:

void FFlatTexture::MakeTexture ()
{
	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	Pixels = new BYTE[Width*Height];
	long numread = lump.Read (Pixels, Width*Height);
	if (numread < Width*Height)
	{
		memset (Pixels + numread, 0xBB, Width*Height - numread);
	}
	FlipSquareBlockRemap (Pixels, Width, Height, GPalette.Remap);
}